

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTHelperVisitors.cpp
# Opt level: O3

optional<std::basic_string_view<char,_std::char_traits<char>_>_> *
getIdentifier(optional<std::basic_string_view<char,_std::char_traits<char>_>_>
              *__return_storage_ptr__,Expression *expr)

{
  Type *pTVar1;
  char *pcVar2;
  bool bVar3;
  Symbol *pSVar4;
  
  if (expr->kind == MemberAccess) {
    pTVar1 = expr[1].type.ptr;
    if ((pTVar1->super_Symbol).kind == ScalarType) {
      pSVar4 = *(Symbol **)&(pTVar1->super_Symbol).indexInScope;
      goto LAB_001a658d;
    }
  }
  else {
    pSVar4 = slang::ast::Expression::getSymbolReference(expr,true);
LAB_001a658d:
    if (pSVar4 != (Symbol *)0x0) {
      pcVar2 = (pSVar4->name)._M_str;
      (__return_storage_ptr__->
      super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>).
      _M_payload.
      super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
      _M_payload._M_value._M_len = (pSVar4->name)._M_len;
      (__return_storage_ptr__->
      super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>).
      _M_payload.
      super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
      _M_payload._M_value._M_str = pcVar2;
      bVar3 = true;
      goto LAB_001a659f;
    }
  }
  bVar3 = false;
LAB_001a659f:
  (__return_storage_ptr__->
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>).
  _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
  _M_engaged = bVar3;
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string_view> getIdentifier(const slang::ast::Expression& expr) {
    const slang::ast::Symbol* symbol = nullptr;
    if (slang::ast::MemberAccessExpression::isKind(expr.kind)) {
        auto& memberAccess = expr.as<slang::ast::MemberAccessExpression>();
        if (slang::ast::NamedValueExpression::isKind(memberAccess.value().kind))
            symbol = &memberAccess.value().as<slang::ast::NamedValueExpression>().symbol;
    }
    else {
        symbol = expr.getSymbolReference();
    }

    if (symbol) {
        return symbol->name;
    }
    return {};
}